

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

bool __thiscall
Lib::
DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::set(DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
      *this,uint key,
     unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
     *val)

{
  uint uVar1;
  Set<Kernel::Term_*,_Lib::DefaultHash> *pSVar2;
  Set<Kernel::Term_*,_Lib::DefaultHash> *__ptr;
  bool bVar3;
  Entry *pEVar4;
  uint uVar5;
  uint uVar6;
  uint local_1c;
  
  local_1c = key;
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  pEVar4 = findEntryToInsert(this,&local_1c);
  uVar6 = (uint)(pEVar4->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  bVar3 = ((pEVar4->field_0)._infoData & 1U) != 0;
  if (bVar3 || uVar6 != uVar1) {
    if (uVar6 == uVar1) {
      this->_deleted = this->_deleted + -1;
      uVar5 = (pEVar4->field_0)._infoData & 0xfffffffe;
    }
    else {
      uVar5 = uVar1 << 2;
    }
    (pEVar4->field_0)._infoData = uVar5;
    pEVar4->_key = local_1c;
    this->_size = this->_size + 1;
  }
  pSVar2 = (val->_M_t).
           super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
           .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl;
  (val->_M_t).
  super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
  .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl =
       (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
  __ptr = (pEVar4->_val)._M_t.
          super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
          .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl;
  (pEVar4->_val)._M_t.
  super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
  .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl = pSVar2;
  if (__ptr != (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0) {
    std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>::operator()
              ((default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *)&pEVar4->_val,__ptr);
  }
  return bVar3 || uVar6 != uVar1;
}

Assistant:

bool set(Key key, Val val)
  {
    ensureExpanded();
    Entry* e = findEntryToInsert(std::move(key));
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      _size++;
    }
    e->_val = std::move(val);
    return !exists;
  }